

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringUtil.hpp
# Opt level: O0

string * limonp::RTrim(string *s)

{
  unary_negate<std::pointer_to_unary_function<unsigned_int,_bool>_> __pred;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_RDI;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_ffffffffffffffa0;
  undefined8 local_50;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffffe0;
  reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffffe8;
  undefined8 in_stack_fffffffffffffff0;
  pointer_to_unary_function<unsigned_int,_bool> pVar1;
  
  pVar1._M_ptr = (_func_bool_uint *)in_RDI;
  std::__cxx11::string::rbegin();
  std::__cxx11::string::rend();
  std::ptr_fun<unsigned_int,bool>((_func_bool_uint *)in_RDI);
  std::not1<std::pointer_to_unary_function<unsigned_int,bool>>
            ((pointer_to_unary_function<unsigned_int,_bool> *)0x15e92b);
  __pred._M_pred._M_ptr = pVar1._M_ptr;
  __pred._0_8_ = in_stack_fffffffffffffff0;
  std::
  find_if<std::reverse_iterator<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>,std::unary_negate<std::pointer_to_unary_function<unsigned_int,bool>>>
            (in_stack_ffffffffffffffe8,
             (reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_ffffffffffffffe0._M_current,__pred);
  std::
  reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::base((reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)&stack0xffffffffffffffe0);
  __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
            (in_stack_ffffffffffffffa0,in_RDI);
  std::__cxx11::string::end();
  __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
            (in_stack_ffffffffffffffa0,in_RDI);
  std::__cxx11::string::erase(in_RDI,in_stack_fffffffffffffff0,local_50);
  return (string *)pVar1._M_ptr;
}

Assistant:

inline std::string& RTrim(std::string &s) {
  s.erase(std::find_if(s.rbegin(), s.rend(), std::not1(std::ptr_fun<unsigned, bool>(IsSpace))).base(), s.end());
  return s;
}